

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O3

void __thiscall
tcu::x11::glx::GlxDisplay::GlxDisplay(GlxDisplay *this,EventState *eventState,char *name)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  int iVar4;
  undefined4 uVar5;
  char *__s;
  TestError *pTVar6;
  pointer_____offset_0x10___ *ppuVar7;
  istringstream extStream;
  allocator<char> local_231;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_200;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_1d0;
  istringstream local_1a0 [120];
  ios_base local_128 [264];
  
  XlibDisplay::XlibDisplay(&this->super_XlibDisplay,eventState,name);
  (this->super_XlibDisplay).super_DisplayBase._vptr_DisplayBase =
       (_func_int **)&PTR__GlxDisplay_00b23da0;
  p_Var1 = &(this->m_extensions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar4 = glXQueryExtension((this->super_XlibDisplay).m_display,&this->m_errorBase,
                            &this->m_eventBase);
  if (iVar4 == 0) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    NotSupportedError::NotSupportedError
              ((NotSupportedError *)pTVar6,"GLX protocol not supported by X server",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0xe4);
    ppuVar7 = &NotSupportedError::typeinfo;
  }
  else {
    iVar4 = glXQueryVersion((this->super_XlibDisplay).m_display,&this->m_majorVersion,
                            &this->m_minorVersion);
    if (iVar4 != 0) {
      uVar5 = XDefaultScreen((this->super_XlibDisplay).m_display);
      __s = (char *)glXQueryServerString((this->super_XlibDisplay).m_display,uVar5,3);
      if (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,__s,&local_231);
        std::__cxx11::istringstream::istringstream(local_1a0,(string *)&local_230,_S_in);
        if ((_Base_ptr *)local_230._M_impl._0_8_ !=
            &local_230._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_230._M_impl._0_8_,
                          (ulong)((long)&(local_230._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        std::
        istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
        ::istream_iterator(&local_1d0,(istream_type *)local_1a0);
        paVar2 = &local_200._M_value.field_2;
        local_200._M_stream = (istream_type *)0x0;
        local_200._M_value._M_string_length = 0;
        local_200._M_value.field_2._M_local_buf[0] = '\0';
        local_200._M_ok = false;
        local_200._M_value._M_dataplus._M_p = (pointer)paVar2;
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::set<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_230,&local_1d0,&local_200);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&(this->m_extensions)._M_t);
        if (local_230._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var3 = &local_230._M_impl.super__Rb_tree_header;
          (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_230._M_impl.super__Rb_tree_header._M_header._M_color;
          (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_230._M_impl.super__Rb_tree_header._M_header._M_parent;
          (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_230._M_impl.super__Rb_tree_header._M_header._M_left;
          (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_230._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_230._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &p_Var1->_M_header;
          (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_230._M_impl.super__Rb_tree_header._M_node_count;
          local_230._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_230._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_230._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
          local_230._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_value._M_dataplus._M_p != paVar2) {
          operator_delete(local_200._M_value._M_dataplus._M_p,
                          CONCAT71(local_200._M_value.field_2._M_allocated_capacity._1_7_,
                                   local_200._M_value.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_value._M_dataplus._M_p != &local_1d0._M_value.field_2) {
          operator_delete(local_1d0._M_value._M_dataplus._M_p,
                          local_1d0._M_value.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::istringstream::~istringstream(local_1a0);
        std::ios_base::~ios_base(local_128);
        return;
      }
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      TestError::TestError
                (pTVar6,"GLX call failed","glXQueryServerString(m_display, screen, GLX_EXTENSIONS)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                 ,0xed);
      __cxa_throw(pTVar6,&TestError::typeinfo,Exception::~Exception);
    }
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    TestError::TestError
              (pTVar6,"GLX call failed",
               "glXQueryVersion(m_display, &m_majorVersion, &m_minorVersion)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0xe6);
    ppuVar7 = &TestError::typeinfo;
  }
  __cxa_throw(pTVar6,ppuVar7,Exception::~Exception);
}

Assistant:

GlxDisplay::GlxDisplay (EventState& eventState, const char* name)
	: XlibDisplay	(eventState, name)
{
	const Bool supported = glXQueryExtension(m_display, &m_errorBase, &m_eventBase);
	if (!supported)
		TCU_THROW(NotSupportedError, "GLX protocol not supported by X server");

	TCU_CHECK_GLX(glXQueryVersion(m_display, &m_majorVersion, &m_minorVersion));

	{
		const int screen = XDefaultScreen(m_display);
		// nVidia doesn't seem to report client-side extensions correctly,
		// so only use server side
		const char* const extensions =
			TCU_CHECK_GLX(glXQueryServerString(m_display, screen, GLX_EXTENSIONS));
		istringstream extStream(extensions);
		m_extensions = set<string>(istream_iterator<string>(extStream),
								   istream_iterator<string>());
	}
}